

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_start_bin(mpack_writer_t *writer,uint32_t count)

{
  uint32_t count_local;
  mpack_writer_t *writer_local;
  
  mpack_writer_track_element(writer);
  mpack_start_bin_notrack(writer,count);
  mpack_writer_track_push(writer,mpack_type_bin,(ulong)count);
  return;
}

Assistant:

void mpack_start_bin(mpack_writer_t* writer, uint32_t count) {
    mpack_writer_track_element(writer);
    mpack_start_bin_notrack(writer, count);
    mpack_writer_track_push(writer, mpack_type_bin, count);
}